

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltalloc.cc
# Opt level: O3

void ltsqueeze(size_t padsz)

{
  short sVar1;
  uintptr_t uVar2;
  ulong uVar3;
  void *pvVar4;
  anon_union_8_2_974a5362_for_CentralCache_3 aVar5;
  uint uVar6;
  uint uVar7;
  anon_union_8_2_974a5362_for_CentralCache_3 *paVar8;
  uint *puVar9;
  Chunk **c;
  anon_union_8_2_974a5362_for_CentralCache_3 aVar10;
  ulong uVar11;
  uint *puVar12;
  anon_union_8_2_974a5362_for_CentralCache_3 aVar13;
  anon_union_8_2_974a5362_for_CentralCache_3 aVar14;
  undefined1 *__s;
  anon_union_8_2_974a5362_for_CentralCache_3 *paVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  uint *puVar19;
  CentralCache *pCVar20;
  int iVar21;
  FreeBlock *additionalBlocksList;
  FreeBlock *freeList;
  FreeBlock *firstBatch;
  FreeBlock *additionalBatchesList;
  char buffer [32768];
  FreeBlock *local_8080;
  anon_union_8_2_974a5362_for_CentralCache_3 local_8078;
  anon_union_8_2_974a5362_for_CentralCache_3 local_8070;
  ulong local_8068;
  anon_union_8_2_974a5362_for_CentralCache_3 local_8060;
  uint local_8054;
  size_t local_8050;
  ulong local_8048;
  size_t local_8040;
  undefined1 local_8038 [32776];
  
  uVar16 = 0x13;
  local_8040 = padsz;
  do {
    if (0x10000 < centralCache[uVar16].maxChunkAddr - centralCache[uVar16].minChunkAddr) {
      pCVar20 = centralCache + uVar16;
      LOCK();
      iVar21 = pCVar20->lock;
      pCVar20->lock = 1;
      UNLOCK();
      while (iVar21 != 0) {
        do {
        } while (pCVar20->lock != 0);
        LOCK();
        iVar21 = pCVar20->lock;
        pCVar20->lock = 1;
        UNLOCK();
      }
      uVar2 = centralCache[uVar16].minChunkAddr;
      local_8048 = centralCache[uVar16].maxChunkAddr - uVar2;
      if (local_8048 < 0x10001) {
        pCVar20->lock = 0;
      }
      else {
        local_8048 = local_8048 >> 0x10;
        local_8050 = local_8048 * 2 + 2;
        local_8048 = local_8048 * 2;
        uVar18 = centralCache[uVar16].freeListSize;
        aVar14 = (anon_union_8_2_974a5362_for_CentralCache_3)centralCache[uVar16].field_3.firstBatch
        ;
        aVar5 = (anon_union_8_2_974a5362_for_CentralCache_3)centralCache[uVar16].freeList;
        centralCache[uVar16].field_3.firstBatch = (FreeBlock *)0x0;
        centralCache[uVar16].freeList = (FreeBlock *)0x0;
        centralCache[uVar16].freeListSize = 0;
        pCVar20->lock = 0;
        local_8078 = aVar5;
        local_8070 = aVar14;
        local_8068 = uVar16;
        if (local_8048 < 0x7fff) {
          __s = local_8038;
          memset(__s,0,local_8050);
        }
        else {
          pvVar4 = mmap((void *)0x0,local_8050,3,0x22,-1,0);
          __s = (undefined1 *)((long)pvVar4 + 1U & 0xfffffffffffffffe);
        }
        uVar3 = local_8068;
        uVar6 = (int)local_8068 - 3;
        if (__s == (undefined1 *)0x0) {
          paVar15 = &local_8070;
          do {
            paVar8 = paVar15;
            paVar15 = (anon_union_8_2_974a5362_for_CentralCache_3 *)&paVar8->firstBatch->nextBatch;
          } while (paVar8->firstBatch != (FreeBlock *)0x0);
          aVar5.firstBatch = (FreeBlock *)&local_8078;
          do {
            aVar10 = aVar5;
            aVar5.firstBatch = (aVar10.firstBatch)->next;
          } while ((aVar10.firstBatch)->next != (FreeBlock *)0x0);
        }
        else {
          uVar6 = (uint)(0xffc0 / (ulong)((uVar6 & 3 | 4) << ((char)(uVar6 >> 2) - 2U & 0x1f)));
          if (aVar14.firstBatch == (FreeBlock *)0x0) {
            puVar12 = (uint *)0x0;
            paVar8 = &local_8070;
          }
          else {
            paVar8 = &local_8070;
            aVar10 = aVar14;
            puVar19 = (uint *)0x0;
            do {
              do {
                uVar11 = (long)aVar10.firstBatch - uVar2 >> 0x10;
                sVar1 = *(short *)(__s + uVar11 * 2);
                *(ushort *)(__s + uVar11 * 2) = sVar1 + 1U;
                puVar12 = puVar19;
                if (uVar6 == (ushort)(sVar1 + 1U)) {
                  puVar12 = (uint *)((ulong)aVar10.firstBatch & 0xffffffffffff0000);
                  if (local_8068 != *puVar12) {
                    __assert_fail("chunk->sizeClass == sizeClass",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/ktnr[P]TwoStepBranchingProcedure/external/ltalloc/ltalloc.cc"
                                  ,0x489,"void ltsqueeze(size_t)");
                  }
                  *(uint **)puVar12 = puVar19;
                }
                aVar10.firstBatch = (aVar10.firstBatch)->next;
                puVar19 = puVar12;
              } while (aVar10.firstBatch != (FreeBlock *)0x0);
              aVar10 = (anon_union_8_2_974a5362_for_CentralCache_3)paVar8->firstBatch->nextBatch;
              paVar8 = (anon_union_8_2_974a5362_for_CentralCache_3 *)&paVar8->firstBatch->nextBatch;
            } while (aVar10.firstBatch != (FreeBlock *)0x0);
          }
          if (aVar5.firstBatch == (FreeBlock *)0x0) {
            aVar10.firstBatch = (FreeBlock *)&local_8078;
          }
          else {
            aVar10.firstBatch = (FreeBlock *)&local_8078;
            aVar13 = aVar5;
            puVar19 = puVar12;
            do {
              uVar11 = (long)aVar13.firstBatch - uVar2 >> 0x10;
              sVar1 = *(short *)(__s + uVar11 * 2);
              *(ushort *)(__s + uVar11 * 2) = sVar1 + 1U;
              puVar12 = puVar19;
              if (uVar6 == (ushort)(sVar1 + 1U)) {
                puVar12 = (uint *)((ulong)aVar13.firstBatch & 0xffffffffffff0000);
                if (local_8068 != *puVar12) {
                  __assert_fail("chunk->sizeClass == sizeClass",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/ktnr[P]TwoStepBranchingProcedure/external/ltalloc/ltalloc.cc"
                                ,0x48b,"void ltsqueeze(size_t)");
                }
                *(uint **)puVar12 = puVar19;
                aVar13.firstBatch = (aVar10.firstBatch)->next;
              }
              aVar10 = aVar13;
              aVar13 = (anon_union_8_2_974a5362_for_CentralCache_3)(aVar10.firstBatch)->next;
              puVar19 = puVar12;
            } while (aVar13.firstBatch != (FreeBlock *)0x0);
          }
          if (puVar12 != (uint *)0x0) {
            uVar7 = 0;
            local_8060.firstBatch = (FreeBlock *)0x0;
            local_8080 = (FreeBlock *)0x0;
            uVar17 = 0xffffU >> ((byte)(local_8068 >> 2) & 0x1f) & 0xff;
            paVar15 = &local_8060;
            aVar10.firstBatch = (FreeBlock *)&local_8080;
            paVar8 = &local_8070;
            uVar18 = uVar17;
            if (aVar14.firstBatch != (FreeBlock *)0x0) {
              local_8054 = uVar17;
              uVar7 = 0;
              aVar13 = aVar14;
LAB_001421cb:
              do {
                if (uVar6 == *(ushort *)(__s + ((long)aVar14.firstBatch - uVar2 >> 0x10) * 2)) {
                  aVar14 = (anon_union_8_2_974a5362_for_CentralCache_3)
                           (aVar13.firstBatch)->nextBatch;
                  do {
                    if (uVar6 == *(ushort *)(__s + ((long)aVar13.firstBatch - uVar2 >> 0x10) * 2)) {
                      aVar13.firstBatch = (aVar13.firstBatch)->next;
                    }
                    else {
                      (aVar10.firstBatch)->next = (FreeBlock *)aVar13;
                      iVar21 = 0;
                      do {
                        aVar10 = aVar13;
                        aVar13.firstBatch = (aVar10.firstBatch)->next;
                        if (uVar7 - uVar17 == iVar21) {
                          paVar15->firstBatch = local_8080;
                          uVar7 = 0;
                          local_8080->nextBatch = (FreeBlock *)0x0;
                          paVar15 = (anon_union_8_2_974a5362_for_CentralCache_3 *)
                                    &local_8080->nextBatch;
                          (aVar10.firstBatch)->next = (FreeBlock *)0x0;
                          local_8080 = (FreeBlock *)0x0;
                          aVar10.firstBatch = (FreeBlock *)&local_8080;
                          goto LAB_0014226a;
                        }
                        if (aVar13.firstBatch == (FreeBlock *)0x0) {
                          uVar7 = (uVar7 - iVar21) + 1;
                          goto LAB_00142276;
                        }
                        iVar21 = iVar21 + -1;
                      } while (uVar6 != *(ushort *)
                                         (__s + ((long)aVar13.firstBatch - uVar2 >> 0x10) * 2));
                      uVar7 = uVar7 - iVar21;
                    }
LAB_0014226a:
                  } while (aVar13.firstBatch != (FreeBlock *)0x0);
LAB_00142276:
                  (aVar10.firstBatch)->next = (FreeBlock *)0x0;
                  paVar8->firstBatch = (FreeBlock *)aVar14;
                }
                else {
                  aVar14 = (anon_union_8_2_974a5362_for_CentralCache_3)(aVar14.firstBatch)->next;
                  if (aVar14.firstBatch != (FreeBlock *)0x0) goto LAB_001421cb;
                  aVar14 = (anon_union_8_2_974a5362_for_CentralCache_3)
                           (aVar13.firstBatch)->nextBatch;
                  paVar8 = (anon_union_8_2_974a5362_for_CentralCache_3 *)
                           &(aVar13.firstBatch)->nextBatch;
                }
                aVar5 = local_8078;
                uVar18 = local_8054;
                aVar13 = aVar14;
              } while (aVar14.firstBatch != (FreeBlock *)0x0);
            }
            aVar14 = aVar10;
            if (aVar5.firstBatch == (FreeBlock *)0x0) {
              aVar5.firstBatch = (FreeBlock *)0x0;
            }
            else {
              do {
                aVar10 = aVar5;
                if (uVar6 == *(ushort *)(__s + ((long)aVar10.firstBatch - uVar2 >> 0x10) * 2)) {
                  aVar5.firstBatch = (aVar10.firstBatch)->next;
                  aVar10 = aVar14;
                }
                else {
                  (aVar14.firstBatch)->next = (FreeBlock *)aVar10;
                  aVar5.firstBatch = (aVar10.firstBatch)->next;
                  (aVar10.firstBatch)->next = (FreeBlock *)0x0;
                  if (uVar7 == uVar18) {
                    paVar15->firstBatch = local_8080;
                    uVar7 = 0;
                    local_8080->nextBatch = (FreeBlock *)0x0;
                    paVar15 = (anon_union_8_2_974a5362_for_CentralCache_3 *)&local_8080->nextBatch;
                    local_8080 = (FreeBlock *)0x0;
                    aVar10.firstBatch = (FreeBlock *)&local_8080;
                  }
                  else {
                    uVar7 = uVar7 + 1;
                  }
                }
                aVar14 = aVar10;
              } while (aVar5.firstBatch != (FreeBlock *)0x0);
              aVar5.firstBatch = *(FreeBlock **)paVar8;
            }
            *paVar15 = aVar5;
            *paVar8 = local_8060;
            local_8078.firstBatch = local_8080;
            LOCK();
            iVar21 = pCVar20->lock;
            pCVar20->lock = 1;
            UNLOCK();
            while (iVar21 != 0) {
              do {
              } while (pCVar20->lock != 0);
              LOCK();
              iVar21 = pCVar20->lock;
              pCVar20->lock = 1;
              UNLOCK();
            }
            *paVar8 = centralCache[uVar16].field_3;
            centralCache[uVar16].field_3 = local_8070;
            (aVar10.firstBatch)->next = centralCache[uVar16].freeList;
            centralCache[uVar16].freeList = (FreeBlock *)local_8078;
            centralCache[uVar16].freeListSize = centralCache[uVar16].freeListSize + uVar7;
            pCVar20->lock = 0;
            if (0x7ffe < local_8048) {
              munmap(__s,local_8050);
            }
            puVar19 = puVar12;
            uVar16 = local_8068;
            if (local_8040 != 0) {
              LOCK();
              UNLOCK();
              if (pad.lock != 0) {
                do {
                } while( true );
              }
              if (pad.size < local_8040) {
                do {
                  puVar9 = puVar19;
                  puVar19 = *(uint **)puVar9;
                  pad.size = pad.size + 0x10000;
                  if (local_8040 <= pad.size) break;
                } while (puVar19 != (uint *)0x0);
                *(void **)puVar9 = pad.freeChunk;
                pad.freeChunk = puVar12;
              }
              pad.lock = 0;
            }
            while (puVar19 != (uint *)0x0) {
              puVar12 = *(uint **)puVar19;
              local_8068 = uVar16;
              munmap(puVar19,0x10000);
              puVar19 = puVar12;
              uVar16 = local_8068;
            }
            goto LAB_0014249e;
          }
        }
        LOCK();
        iVar21 = pCVar20->lock;
        pCVar20->lock = 1;
        UNLOCK();
        while (iVar21 != 0) {
          do {
          } while (pCVar20->lock != 0);
          LOCK();
          iVar21 = pCVar20->lock;
          pCVar20->lock = 1;
          UNLOCK();
        }
        *paVar8 = centralCache[uVar16].field_3;
        centralCache[uVar16].field_3.firstBatch = (FreeBlock *)local_8070;
        (aVar10.firstBatch)->next = centralCache[uVar16].freeList;
        centralCache[uVar16].freeList = (FreeBlock *)local_8078;
        centralCache[uVar16].freeListSize = centralCache[uVar16].freeListSize + uVar18;
        pCVar20->lock = 0;
        uVar16 = uVar3;
        if (0x7ffe < local_8048) {
          munmap(__s,local_8050);
          uVar16 = local_8068;
        }
      }
    }
LAB_0014249e:
    uVar16 = uVar16 + 1;
    if (uVar16 == 0x104) {
      return;
    }
  } while( true );
}

Assistant:

void ltsqueeze(size_t padsz)
{
	unsigned int sizeClass = get_size_class(2 * sizeof(void*));//skip small chunks because corresponding batches can not be efficiently detached from the central cache (if that becomes relevant, may be it worths to reimplement batches for small chunks from array to linked lists)
	for (; sizeClass < NUMBER_OF_SIZE_CLASSES; sizeClass++)
	{
		CentralCache* cc = &centralCache[sizeClass];
		if (cc->maxChunkAddr - cc->minChunkAddr <= CHUNK_SIZE)//preliminary check without lock (assume that writing to minChunkAddr/maxChunkAddr is atomic)
			continue;

		SPINLOCK_ACQUIRE(&cc->lock);
		if (cc->maxChunkAddr - cc->minChunkAddr <= CHUNK_SIZE) {//quick check for theoretical possibility that at least one chunk is totally free
			SPINLOCK_RELEASE(&cc->lock);
			continue;
		}
		{uintptr_t minChunkAddr = cc->minChunkAddr;
		size_t bufferSize = ((cc->maxChunkAddr - minChunkAddr) / CHUNK_SIZE + 1) * sizeof(short);
		//Quickly detach all batches of the current size class from the central cache
		unsigned int freeListSize = cc->freeListSize;
		FreeBlock* firstBatch = cc->firstBatch, * freeList = cc->freeList;
		cc->firstBatch = NULL;
		cc->freeList = NULL;
		cc->freeListSize = 0;
		SPINLOCK_RELEASE(&cc->lock);

		//1. Find out chunks with only free blocks via a simple counting the number of free blocks in each chunk
		{char buffer[32 * 1024];//enough for 1GB address space
		unsigned short* inChunkFreeBlocks = (unsigned short*)(bufferSize <= sizeof(buffer) ? memset(buffer, 0, bufferSize) : LTALLOC_VMALLOC(bufferSize));
		unsigned int numBlocksInChunk = (CHUNK_SIZE - (/*CHUNK_IS_SMALL ? sizeof(ChunkSm) : */sizeof(Chunk))) / class_to_size(sizeClass);
		FreeBlock** pbatch, * block, ** pblock;
		Chunk* firstFreeChunk = NULL;
		LTALLOC_ASSERT(numBlocksInChunk < (1U << (sizeof(short) * 8)));//in case if CHUNK_SIZE is too big that total count of blocks in it doesn't fit at short type (...may be use static_assert instead?)
		if (inChunkFreeBlocks)//consider VMALLOC can fail
		{
			for (pbatch = &firstBatch; *pbatch; pbatch = &(*pbatch)->nextBatch)
				for (block = *pbatch; block; block = block->next)
#define FREE_BLOCK(block) \
					if (++inChunkFreeBlocks[((uintptr_t)block - minChunkAddr) / CHUNK_SIZE] == numBlocksInChunk)/*chunk is totally free*/\
					{\
						Chunk *chunk = (Chunk*)((uintptr_t)block & ~(CHUNK_SIZE-1));\
						LTALLOC_ASSERT(chunk->sizeClass == sizeClass);/*just in case check before overwriting this info*/\
						*(Chunk**)chunk = firstFreeChunk;/*put nextFreeChunk pointer right at the beginning of Chunk as there are always must be a space for one pointer before first memory block*/\
						firstFreeChunk = chunk;\
					}
					FREE_BLOCK(block)
					for (pblock = &freeList; *pblock; pblock = &(*pblock)->next)
						FREE_BLOCK(*pblock)
#undef FREE_BLOCK
		}
		else {
			for (pbatch = &firstBatch; *pbatch; pbatch = &(*pbatch)->nextBatch);
			for (pblock = &freeList; *pblock; pblock = &(*pblock)->next);
		}

		if (firstFreeChunk)//is anything to release
		{
			//2. Unlink all matching blocks from the corresponding free lists
			FreeBlock* additionalBatchesList = NULL, * additionalBlocksList = NULL, ** abatch = &additionalBatchesList, ** ablock = &additionalBlocksList;
			unsigned int additionalBlocksListSize = 0, batchSize = batch_size(sizeClass) + 1;
			for (pbatch = &firstBatch; *pbatch;)
			{
				for (block = *pbatch; block; block = block->next)
					if (inChunkFreeBlocks[((uintptr_t)block - minChunkAddr) / CHUNK_SIZE] == numBlocksInChunk)//if at least one block belongs to a releasable chunk, then this batch should be handled specially
					{
						FreeBlock* nextBatch = (*pbatch)->nextBatch;
						for (block = *pbatch; block;)//re-add blocks of not-for-release chunks and organize them into another batches' list (to join it with the main later)
							if (inChunkFreeBlocks[((uintptr_t)block - minChunkAddr) / CHUNK_SIZE] != numBlocksInChunk)//skip matching-for-release blocks
							{
								*ablock = block;
								do//this loop needed only to minimize memory write operations, otherwise a simpler approach could be used (like in the next loop below)
								{
									ablock = &block->next;
									block = block->next;
									if (++additionalBlocksListSize == batchSize)
									{
										abatch = &(*abatch = additionalBlocksList)->nextBatch;
										*abatch = NULL;
										*ablock = NULL;
										ablock = &additionalBlocksList;
										additionalBlocksList = NULL;
										additionalBlocksListSize = 0;
										break;//to force *ablock = block; for starting a new batch
									}
								} while (block && inChunkFreeBlocks[((uintptr_t)block - minChunkAddr) / CHUNK_SIZE] != numBlocksInChunk);
							}
							else
								block = block->next;
						*ablock = NULL;
						*pbatch = nextBatch;//unlink batch
						goto continue_;
					}
				pbatch = &(*pbatch)->nextBatch;
			continue_:;
			}
			for (block = freeList; block;)
				if (inChunkFreeBlocks[((uintptr_t)block - minChunkAddr) / CHUNK_SIZE] != numBlocksInChunk)
				{
					//*pblock = (*pblock)->next, freeListSize--;//unlink block
					ablock = &(*ablock = block)->next;
					block = block->next;
					*ablock = NULL;
					if (++additionalBlocksListSize == batchSize)
					{
						abatch = &(*abatch = additionalBlocksList)->nextBatch;
						*abatch = NULL;
						ablock = &additionalBlocksList;
						additionalBlocksList = NULL;
						additionalBlocksListSize = 0;
					}
				}
				else
					block = block->next;
			//Add additional lists
			*abatch = *pbatch;
			*pbatch = additionalBatchesList;
			pblock = ablock;
			freeList = additionalBlocksList;
			freeListSize = additionalBlocksListSize;

			//Return back all left not-for-release blocks to the central cache as quickly as possible (as other threads may want to allocate a new memory)
#define GIVE_LISTS_BACK_TO_CC \
			SPINLOCK_ACQUIRE(&cc->lock);\
			*pbatch = cc->firstBatch;\
			cc->firstBatch = firstBatch;\
			*pblock = cc->freeList;\
			cc->freeList = freeList;\
			cc->freeListSize += freeListSize;\
			SPINLOCK_RELEASE(&cc->lock);\
			if (bufferSize > sizeof(buffer)) LTALLOC_VMFREE(inChunkFreeBlocks, bufferSize);//this better to do before 3. as kernel is likely optimized for release of just allocated range
			GIVE_LISTS_BACK_TO_CC

				if (padsz)
				{
					SPINLOCK_ACQUIRE(&pad.lock);
					if (pad.size < padsz)
					{
						Chunk* first = firstFreeChunk, ** c;
						do//put off free chunks up to a specified pad size
						{
							c = (Chunk**)firstFreeChunk;
							firstFreeChunk = *c;
							pad.size += CHUNK_SIZE;
						} while (pad.size < padsz && firstFreeChunk);
						*c = (Chunk*)pad.freeChunk;
						pad.freeChunk = first;
					}
					SPINLOCK_RELEASE(&pad.lock);
				}

			//3. Return memory to the system
			while (firstFreeChunk)
			{
				Chunk* nextFreeChunk = *(Chunk**)firstFreeChunk;
				LTALLOC_VMFREE(firstFreeChunk, CHUNK_SIZE);
				firstFreeChunk = nextFreeChunk;
			}
		}
		else//nothing to release - just return batches back to the central cache
		{
			GIVE_LISTS_BACK_TO_CC
#undef GIVE_LISTS_BACK_TO_CC
		}}}
	}
}